

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

const_iterator __thiscall
Quest_Context::UnserializeProgress(Quest_Context *this,const_iterator it,const_iterator end)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  mapped_type *pmVar4;
  bool bVar5;
  short local_4a;
  int state;
  short value;
  string key;
  Quest_Context *this_local;
  const_iterator end_local;
  const_iterator it_local;
  
  key.field_2._8_8_ = this;
  this_local = (Quest_Context *)end._M_current;
  end_local = it;
  bVar1 = __gnu_cxx::operator==
                    (&end_local,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local);
  if ((bVar1) ||
     (pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&end_local), *pcVar3 != '{')) {
    it_local = end_local;
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&end_local);
    std::__cxx11::string::string((string *)&state);
    local_4a = 0;
    bVar1 = false;
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&end_local,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&this_local);
      bVar5 = false;
      if (bVar2) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&end_local);
        bVar5 = *pcVar3 != '}';
      }
      if (!bVar5) break;
      if (bVar1) {
        if (bVar1) {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&end_local);
          if (*pcVar3 == ',') {
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                     ::operator[](&this->progress,(key_type *)&state);
            *pmVar4 = local_4a;
            std::__cxx11::string::operator=((string *)&state,"");
            local_4a = 0;
            bVar1 = false;
          }
          else {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&end_local);
            local_4a = local_4a * 10 + *pcVar3 + -0x30;
          }
        }
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&end_local);
        if (*pcVar3 == '=') {
          bVar1 = true;
        }
        else {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&end_local);
          std::__cxx11::string::operator+=((string *)&state,*pcVar3);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end_local);
    }
    if (bVar1) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](&this->progress,(key_type *)&state);
      *pmVar4 = local_4a;
    }
    bVar1 = __gnu_cxx::operator!=
                      (&end_local,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&this_local);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end_local);
    }
    it_local = end_local;
    std::__cxx11::string::~string((string *)&state);
  }
  return (const_iterator)it_local._M_current;
}

Assistant:

std::string::const_iterator Quest_Context::UnserializeProgress(std::string::const_iterator it, std::string::const_iterator end)
{
	if (it == end || *it != '{')
		return it;

	++it;

	std::string key;
	short value = 0;
	int state = 0;

	for (; it != end && *it != '}'; ++it)
	{
		if (state == 0) // Reading key
		{
			if (*it == '=')
			{
				state = 1;
			}
			else
			{
				key += *it;
			}
		}
		else if (state == 1) // Reading value
		{
			if (*it == ',')
			{
				this->progress[key] = value;
				key = "";
				value = 0;
				state = 0;
			}
			else
			{
				value *= 10;
				value += *it - '0';
			}
		}
	}

	if (state == 1)
		this->progress[key] = value;

	if (it != end)
		++it;

	return it;
}